

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode
JsDiagEvaluate(JsValueRef expressionVal,uint stackFrameIndex,JsParseScriptAttributes parseAttributes
              ,bool forceSetValueProp,JsValueRef *evalResult)

{
  JsrtRuntime *this;
  DebugManager *pDVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  JsErrorCode JVar5;
  uint uVar6;
  int iVar7;
  JsrtContext *pJVar8;
  ArrayBuffer *pAVar9;
  undefined4 extraout_var;
  undefined4 *puVar10;
  undefined1 source [8];
  JavascriptString *pJVar11;
  undefined4 extraout_var_01;
  JsrtDebugManager *this_00;
  DynamicObject *local_88;
  ulong local_80;
  undefined1 local_78 [8];
  TTDebuggerAbortException anon_var_0;
  JsrtDebuggerStackFrame *debuggerStackFrame;
  AutoNestedHandledExceptionType local_3c;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined4 extraout_var_00;
  
  pJVar8 = JsrtContext::GetCurrent();
  JVar5 = CheckContext(pJVar8,false,false);
  if (JVar5 != JsNoError) {
    return JVar5;
  }
  pSStack_38 = (((pJVar8->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_3c,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JVar5 = JsErrorNullArgument;
  if (evalResult != (JsValueRef *)0x0 && expressionVal != (JsValueRef)0x0) {
    bVar3 = Js::VarIs<Js::ArrayBuffer>(expressionVal);
    if (bVar3) {
      pAVar9 = Js::VarTo<Js::ArrayBuffer>(expressionVal);
      uVar6 = (*(pAVar9->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(pAVar9);
    }
    else {
      bVar4 = Js::VarIs<Js::JavascriptString>(expressionVal);
      JVar5 = JsErrorInvalidArgument;
      if (!bVar4) goto LAB_003a4c1d;
      pJVar11 = Js::VarTo<Js::JavascriptString>(expressionVal);
      uVar6 = Js::JavascriptString::GetLength(pJVar11);
    }
    if ((int)uVar6 < 0) {
      JVar5 = JsErrorInvalidArgument;
    }
    else {
      local_78 = (undefined1  [8])0x0;
      if (bVar3 && (char)((parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) >> 1)
                   == '\0') {
        pAVar9 = Js::VarTo<Js::ArrayBuffer>(expressionVal);
        iVar7 = (*(pAVar9->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pAVar9);
        anon_var_0.m_staticAbortMessage = (char16 *)CONCAT44(extraout_var,iVar7);
        utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
        Initialize((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                    *)local_78,(char **)&anon_var_0.m_staticAbortMessage,(ulong)uVar6);
        source = local_78;
        if (local_78 == (undefined1  [8])0x0) {
          utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
          ::~NarrowWideConverter
                    ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                      *)local_78);
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                             ,0x11f,
                             "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                             ,
                             "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar10 = 0;
          JVar5 = JsErrorOutOfMemory;
          goto LAB_003a4c1d;
        }
      }
      else if (bVar3) {
        pAVar9 = Js::VarTo<Js::ArrayBuffer>(expressionVal);
        iVar7 = (*(pAVar9->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(pAVar9);
        source = (undefined1  [8])CONCAT44(extraout_var_00,iVar7);
      }
      else {
        pJVar11 = Js::VarTo<Js::JavascriptString>(expressionVal);
        iVar7 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar11);
        source = (undefined1  [8])CONCAT44(extraout_var_01,iVar7);
      }
      *evalResult = (JsValueRef)0x0;
      local_80 = (ulong)uVar6;
      pJVar8 = JsrtContext::GetCurrent();
      this = (pJVar8->runtime).ptr;
      pDVar1 = this->threadContext->debugManager;
      JVar5 = JsErrorDiagNotAtBreak;
      if ((pDVar1 != (DebugManager *)0x0) && (pDVar1->isAtDispatchHalt != false)) {
        this_00 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar5 = JsErrorDiagNotInDebugMode;
        if ((this_00 != (JsrtDebugManager *)0x0) &&
           (bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(this_00), bVar3)) {
          anon_var_0.m_staticAbortMessage = (char16 *)0x0;
          bVar3 = JsrtDebugManager::TryGetFrameObjectFromFrameIndex
                            (this_00,pSStack_38,stackFrameIndex,
                             (JsrtDebuggerStackFrame **)&anon_var_0.m_staticAbortMessage);
          JVar5 = JsErrorDiagObjectNotFound;
          if (bVar3) {
            local_88 = (DynamicObject *)0x0;
            bVar3 = JsrtDebuggerStackFrame::Evaluate
                              ((JsrtDebuggerStackFrame *)anon_var_0.m_staticAbortMessage,pSStack_38,
                               (char16 *)source,(int)local_80,false,forceSetValueProp,&local_88);
            if (local_88 != (DynamicObject *)0x0) {
              *evalResult = local_88;
            }
            JVar5 = JsErrorScriptException;
            if (bVar3) {
              JVar5 = JsNoError;
            }
          }
        }
      }
      utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
      ~NarrowWideConverter
                ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                  *)local_78);
    }
  }
LAB_003a4c1d:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  return JVar5;
}

Assistant:

CHAKRA_API JsDiagEvaluate(
    _In_ JsValueRef expressionVal,
    _In_ unsigned int stackFrameIndex,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ bool forceSetValueProp,
    _Out_ JsValueRef *evalResult)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        PARAM_NOT_NULL(expressionVal);
        PARAM_NOT_NULL(evalResult);

        bool isArrayBuffer = Js::VarIs<Js::ArrayBuffer>(expressionVal),
             isString = false;
        bool isUtf8   = !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

        if (!isArrayBuffer)
        {
            isString = Js::VarIs<Js::JavascriptString>(expressionVal);
            if (!isString)
            {
                return JsErrorInvalidArgument;
            }
        }

        const size_t len = isArrayBuffer ?
            Js::VarTo<Js::ArrayBuffer>(expressionVal)->GetByteLength() :
            Js::VarTo<Js::JavascriptString>(expressionVal)->GetLength();

        if (len > INT_MAX)
        {
            return JsErrorInvalidArgument;
        }

        const WCHAR* expression;
        utf8::NarrowToWide wide_expression;
        if (isArrayBuffer && isUtf8)
        {
            wide_expression.Initialize(
                (const char*)Js::VarTo<Js::ArrayBuffer>(expressionVal)->GetBuffer(), len);
            if (!wide_expression)
            {
                return JsErrorOutOfMemory;
            }
            expression = wide_expression;
        }
        else
        {
            expression = !isArrayBuffer ?
                Js::VarTo<Js::JavascriptString>(expressionVal)->GetSz() // String
                :
                (const WCHAR*)Js::VarTo<Js::ArrayBuffer>(expressionVal)->GetBuffer(); // ArrayBuffer;
        }

        *evalResult = JS_INVALID_REFERENCE;

        JsrtContext* context = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = context->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        JsrtDebuggerStackFrame* debuggerStackFrame = nullptr;
        if (!jsrtDebugManager->TryGetFrameObjectFromFrameIndex(scriptContext, stackFrameIndex, &debuggerStackFrame))
        {
            return JsErrorDiagObjectNotFound;
        }

        Js::DynamicObject* result = nullptr;
        bool success = debuggerStackFrame->Evaluate(scriptContext, expression, static_cast<int>(len), false, forceSetValueProp, &result);

        if (result != nullptr)
        {
            *evalResult = result;
        }

        return success ? JsNoError : JsErrorScriptException;

    }, false /*allowInObjectBeforeCollectCallback*/, true /*scriptExceptionAllowed*/);
#endif
}